

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall Catch::Optional<Catch::AssertionStats>::reset(Optional<Catch::AssertionStats> *this)

{
  Optional<Catch::AssertionStats> *this_local;
  
  if (this->nullableValue != (AssertionStats *)0x0) {
    AssertionStats::~AssertionStats(this->nullableValue);
  }
  this->nullableValue = (AssertionStats *)0x0;
  return;
}

Assistant:

void reset() {
            if ( nullableValue ) { nullableValue->~T(); }
            nullableValue = nullptr;
        }